

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

FloatTextureHandle __thiscall
pbrt::FloatScaledTexture::Create
          (FloatScaledTexture *this,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong *puVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined8 *puVar7;
  FloatTextureHandle tex;
  FloatTextureHandle scale;
  Float cs;
  string ret;
  undefined1 local_60 [20];
  float local_4c;
  string local_48;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"tex","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_60,(string *)parameters,1.0,
             (memory_resource *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"scale","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_60 + 8),(string *)parameters,1.0,
             (memory_resource *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  iVar6 = 1;
  uVar2 = local_60._0_8_;
  uVar3 = local_60._8_8_;
  do {
    local_60._8_8_ = uVar3;
    local_60._0_8_ = uVar2;
    if ((float *)(local_60._8_8_ & 0xffffffffffff) != (float *)0x0 &&
        (local_60._8_8_ & 0xffff000000000000) == 0x5000000000000) {
      local_4c = *(float *)(local_60._8_8_ & 0xffffffffffff);
      if ((local_4c == 1.0) && (!NAN(local_4c))) {
        if (LOGGING_LogLevel < 1) {
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
              ,0x302,"Dropping useless scale by 1");
        }
        (this->tex).
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = 0;
        goto LAB_0055912c;
      }
      puVar7 = (undefined8 *)(local_60._0_8_ & 0xffffffffffff);
      if (puVar7 != (undefined8 *)0x0 && (local_60._0_8_ & 0xffff000000000000) == 0x1000000000000) {
        iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
        puVar5 = (undefined8 *)CONCAT44(extraout_var_00,iVar6);
        *puVar5 = 0;
        *puVar5 = *puVar7;
        uVar2 = puVar7[2];
        puVar5[1] = puVar7[1];
        puVar5[2] = uVar2;
        if (LOGGING_LogLevel < 1) {
          local_48._M_string_length = 0;
          local_48.field_2._M_local_buf[0] = '\0';
          local_48._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<float&>
                    (&local_48,"Flattened scale %f * image texture",&local_4c);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
              ,0x308,local_48._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,
                            CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                     local_48.field_2._M_local_buf[0]) + 1);
          }
        }
        *(float *)(puVar5 + 1) = local_4c * *(float *)(puVar5 + 1);
        (this->tex).
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = (ulong)puVar5 | 0x1000000000000;
        return (FloatTextureHandle)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )this;
      }
    }
    iVar6 = iVar6 + -1;
    uVar2 = local_60._8_8_;
    uVar3 = local_60._0_8_;
    if (iVar6 != 0) {
      iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,8);
      puVar4 = (ulong *)CONCAT44(extraout_var,iVar6);
      *puVar4 = local_60._0_8_;
      puVar4[1] = local_60._8_8_;
      local_60._0_8_ = (ulong)puVar4 | 0x4000000000000;
LAB_0055912c:
      (this->tex).
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = local_60._0_8_;
      return (FloatTextureHandle)
             (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              )this;
    }
  } while( true );
}

Assistant:

FloatTextureHandle FloatScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle tex = parameters.GetFloatTexture("tex", 1.f, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    for (int i = 0; i < 2; ++i) {
        if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
            Float cs = cscale->Evaluate({});
            if (cs == 1) {
                LOG_VERBOSE("Dropping useless scale by 1");
                return tex;
            } else if (FloatImageTexture *image =
                           tex.CastOrNullptr<FloatImageTexture>()) {
                FloatImageTexture *imageCopy =
                    alloc.new_object<FloatImageTexture>(*image);
                LOG_VERBOSE("Flattened scale %f * image texture", cs);
                imageCopy->scale *= cs;
                return imageCopy;
            }
#if defined(PBRT_BUILD_GPU_RENDERER)
            else if (GPUFloatImageTexture *gimage =
                         tex.CastOrNullptr<GPUFloatImageTexture>()) {
                GPUFloatImageTexture *gimageCopy =
                    alloc.new_object<GPUFloatImageTexture>(*gimage);
                LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
                gimageCopy->scale *= cs;
                return gimageCopy;
            }
#endif
        }
        std::swap(tex, scale);
    }

    std::swap(tex, scale);
    return alloc.new_object<FloatScaledTexture>(tex, scale);
}